

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChValueSpecific<chrono::ChFrameMoving<double>_>::ChValueSpecific
          (ChValueSpecific<chrono::ChFrameMoving<double>_> *this,ChFrameMoving<double> *mvalp,
          char *mname,char flags)

{
  char flags_local;
  char *mname_local;
  ChFrameMoving<double> *mvalp_local;
  ChValueSpecific<chrono::ChFrameMoving<double>_> *this_local;
  
  ChValue::ChValue(&this->super_ChValue);
  (this->super_ChValue)._vptr_ChValue = (_func_int **)&PTR__ChValueSpecific_0014fcb0;
  this->_ptr_to_val = mvalp;
  std::__cxx11::string::operator=((string *)&(this->super_ChValue)._name,mname);
  (this->super_ChValue)._flags = flags;
  return;
}

Assistant:

ChValueSpecific(TClass& mvalp, const char* mname, char flags) { 
          _ptr_to_val = (TClass*)(& mvalp);
          _name = mname;
          _flags = flags;
      }